

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_nop_absolute_x_instructions.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1cf683::NopAbsoluteXFixture::~NopAbsoluteXFixture(NopAbsoluteXFixture *this)

{
  (this->super_CpuTest).super_Test._vptr_Test = (_func_int **)&PTR__CpuTest_00267900;
  testing::InSequence::~InSequence(&(this->super_CpuTest).in_sequence);
  std::unique_ptr<n_e_s::core::IMos6502,_std::default_delete<n_e_s::core::IMos6502>_>::~unique_ptr
            (&(this->super_CpuTest).cpu);
  testing::NiceMock<n_e_s::core::test::MockMmu>::~NiceMock(&(this->super_CpuTest).mmu);
  testing::Test::~Test((Test *)this);
  return;
}

Assistant:

TEST_P(NopAbsoluteXFixture, nop_absx) {
    stage_instruction(GetParam());
    expected.pc += 2;

    EXPECT_CALL(mmu, read_byte(registers.pc + 1)).WillOnce(Return(0x34));
    EXPECT_CALL(mmu, read_byte(registers.pc + 2)).WillOnce(Return(0x12));

    step_execution(4);
    EXPECT_EQ(expected, registers);
}